

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

bool __thiscall Clasp::Solver::unitPropagate(Solver *this)

{
  size_type sVar1;
  uint uVar2;
  Literal p;
  SharedContext *pSVar3;
  bool bVar4;
  PropResult PVar5;
  uint uVar6;
  long lVar7;
  pointer pLVar8;
  reverse_iterator<Clasp::GenericWatch_*> __tmp;
  pointer plVar9;
  buf_type *pbVar10;
  ulong uVar11;
  ulong uVar12;
  buf_type *pbVar13;
  uint uVar14;
  buf_type *pbVar15;
  
  sVar1 = (this->levels_).super_type.ebo_.size;
  uVar6 = (this->assign_).front;
  if (uVar6 != (this->assign_).trail.ebo_.size) {
    pSVar3 = this->shared_;
    uVar2 = (pSVar3->btig_).graph_.ebo_.size;
    do {
      (this->assign_).front = uVar6 + 1;
      pLVar8 = (this->assign_).trail.ebo_.buf;
      p.rep_ = pLVar8[uVar6].rep_;
      plVar9 = (this->watches_).ebo_.buf + (p.rep_ >> 1);
      if ((p.rep_ >> 1 < uVar2) &&
         (bVar4 = ShortImplicationsGraph::propagate(&pSVar3->btig_,this,p), !bVar4)) {
        return false;
      }
      uVar6 = (plVar9->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
              left_;
      uVar12 = (ulong)uVar6;
      if (7 < uVar12) {
        pbVar10 = (plVar9->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>
                  .buf_;
        uVar11 = 0;
        pbVar15 = pbVar10;
        while (uVar12 != uVar11) {
          PVar5 = ClauseHead::propagate(*(ClauseHead **)(pbVar10 + uVar11),this,p,&pLVar8->rep_);
          if (((ushort)PVar5 >> 8 & 1) != 0) {
            pLVar8 = *(pointer *)(pbVar10 + uVar11);
            *(pointer *)pbVar15 = pLVar8;
            pbVar15 = pbVar15 + 8;
          }
          uVar11 = uVar11 + 8;
          if (((ushort)PVar5 & 1) == 0) {
            if (uVar12 != uVar11) {
              memmove(pbVar15,pbVar10 + uVar11,uVar12 - uVar11);
            }
            (plVar9->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.left_
                 = (uVar6 + ((int)pbVar15 -
                            *(int *)&(plVar9->super_type).
                                     super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
                                     buf_)) - (int)uVar11;
            return false;
          }
        }
        (plVar9->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.left_ =
             (int)pbVar15 -
             *(int *)&(plVar9->super_type).
                      super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_;
      }
      uVar6 = (plVar9->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
              right_;
      uVar12 = (ulong)uVar6;
      uVar14 = *(uint *)&(plVar9->super_type).
                         super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.field_0x8 &
               0x7fffffff;
      uVar11 = (ulong)uVar14;
      if (0xf < uVar14 - uVar6) {
        pbVar15 = (plVar9->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>
                  .buf_;
        pbVar10 = pbVar15 + uVar11;
        while (pbVar13 = pbVar15, uVar11 != uVar12) {
          uVar6 = (**(code **)**(undefined8 **)(pbVar13 + uVar11 + -0x10))
                            (*(undefined8 **)(pbVar13 + uVar11 + -0x10),this,p.rep_);
          if ((uVar6 >> 8 & 1) != 0) {
            *(undefined4 *)(pbVar10 + -8) = *(undefined4 *)(pbVar13 + uVar11 + -8);
            *(undefined8 *)(pbVar10 + -0x10) = *(undefined8 *)(pbVar13 + uVar11 + -0x10);
            pbVar10 = pbVar10 + -0x10;
          }
          uVar12 = uVar12 + 0x10;
          pbVar15 = pbVar13 + -0x10;
          if ((uVar6 & 1) == 0) {
            lVar7 = (long)(uVar11 - uVar12) >> 4;
            if (0 < lVar7) {
              uVar12 = lVar7 + 1;
              lVar7 = 0;
              do {
                *(undefined4 *)(pbVar10 + lVar7 + -8) =
                     *(undefined4 *)(pbVar13 + uVar11 + lVar7 + -0x18);
                *(undefined8 *)(pbVar10 + lVar7 + -0x10) =
                     *(undefined8 *)(pbVar13 + uVar11 + lVar7 + -0x20);
                lVar7 = lVar7 + -0x10;
                uVar12 = uVar12 - 1;
              } while (1 < uVar12);
              (plVar9->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
              right_ = (int)lVar7 +
                       ((int)pbVar10 -
                       *(int *)&(plVar9->super_type).
                                super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_);
              return false;
            }
            (plVar9->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
            right_ = (int)pbVar10 -
                     *(int *)&(plVar9->super_type).
                              super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_;
            return false;
          }
        }
        (plVar9->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.right_ =
             (int)pbVar10 -
             *(int *)&(plVar9->super_type).
                      super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_;
      }
      uVar6 = (this->assign_).front;
    } while (uVar6 != (this->assign_).trail.ebo_.size);
  }
  if (sVar1 == 0) {
    bVar4 = Assignment::markUnits(&this->assign_);
    return bVar4;
  }
  return true;
}

Assistant:

bool Solver::unitPropagate() {
	assert(!hasConflict());
	Literal p, q, r;
	uint32 idx, ignore, DL = decisionLevel();
	const ShortImplicationsGraph& btig = shared_->shortImplications();
	const uint32 maxIdx = btig.size();
	while ( !assign_.qEmpty() ) {
		p             = assign_.qPop();
		idx           = p.id();
		WatchList& wl = watches_[idx];
		// first: short clause BCP
		if (idx < maxIdx && !btig.propagate(*this, p)) {
			return false;
		}
		// second: clause BCP
		if (wl.left_size() != 0) {
			WatchList::left_iterator it, end, j = wl.left_begin();
			Constraint::PropResult res;
			for (it = wl.left_begin(), end = wl.left_end();  it != end;  ) {
				ClauseWatch& w = *it++;
				res = w.head->ClauseHead::propagate(*this, p, ignore);
				if (res.keepWatch) {
					*j++ = w;
				}
				if (!res.ok) {
					wl.shrink_left(std::copy(it, end, j));
					return false;
				}
			}
			wl.shrink_left(j);
		}
		// third: general constraint BCP
		if (wl.right_size() != 0) {
			WatchList::right_iterator it, end, j = wl.right_begin();
			Constraint::PropResult res;
			for (it = wl.right_begin(), end = wl.right_end(); it != end; ) {
				GenericWatch& w = *it++;
				res = w.propagate(*this, p);
				if (res.keepWatch) {
					*j++ = w;
				}
				if (!res.ok) {
					wl.shrink_right(std::copy(it, end, j));
					return false;
				}
			}
			wl.shrink_right(j);
		}
	}
	return DL || assign_.markUnits();
}